

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_scan.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_e9e2::
ARTScanTest_scanRangeForwardOneLeaf_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::ARTScanTest_scanRangeForwardOneLeaf_Test
          (ARTScanTest_scanRangeForwardOneLeaf_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTScanTest_scanRangeForwardOneLeaf_Test<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ARTScanTest<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>::
  ARTScanTest(&this->
               super_ARTScanTest<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
             );
  (this->
  super_ARTScanTest<unodb::db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>)
  .super_Test._vptr_Test = (_func_int **)&PTR__ARTScanTest_scanRangeForwardOneLeaf_Test_003adbe0;
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTScanTest, scanRangeForwardOneLeaf) {
  unodb::test::tree_verifier<TypeParam> verifier;
  TypeParam& db = verifier.get_db();  // reference to test db instance.
  verifier.insert(0, unodb::test::test_values[0]);
  uint64_t n = 0;
  std::uint64_t visited_key{~0ULL};
  typename TypeParam::value_view visited_val{};
  const auto fn = [&n, &visited_key, &visited_val](
                      const unodb::visitor<typename TypeParam::iterator>&
                          v) noexcept(noexcept(v.get_key())) {
    n++;
    visited_key = decode(v.get_key());
    visited_val = v.get_value();
    return false;
  };
  db.scan_range(0, 1, fn);
  UNODB_EXPECT_EQ(1, n);
  UNODB_EXPECT_EQ(visited_key, 0);
  UNODB_EXPECT_TRUE(
      std::ranges::equal(visited_val, unodb::test::test_values[0]));
}